

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialDistrFunc.cpp
# Opt level: O0

void __thiscall
OpenMD::RadialDistrFunc::RadialDistrFunc
          (RadialDistrFunc *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          uint nbins)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  string *in_RCX;
  long *in_RDI;
  string *in_R8;
  int nIntersect;
  undefined4 in_stack_fffffffffffffc88;
  uint in_stack_fffffffffffffc8c;
  SelectionManager *in_stack_fffffffffffffc90;
  SelectionManager *pSVar5;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  StaticAnalyser *in_stack_fffffffffffffca0;
  SelectionManager *in_stack_fffffffffffffcb0;
  undefined6 in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  SelectionEvaluator *this_00;
  SimInfo *in_stack_fffffffffffffd88;
  SelectionEvaluator *in_stack_fffffffffffffd90;
  SimInfo *in_stack_ffffffffffffff38;
  SelectionManager *in_stack_ffffffffffffff40;
  
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffca0,
             (SimInfo *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
             (string *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
  *in_RDI = (long)&PTR__RadialDistrFunc_0055fd68;
  std::__cxx11::string::string((string *)(in_RDI + 0x1a),in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 0x1e),in_R8);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this_00 = (SelectionEvaluator *)(in_RDI + 0x1db);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SelectionEvaluator::loadScriptString
            (this_00,(string *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
  SelectionEvaluator::loadScriptString
            (this_00,(string *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x23));
  if (!bVar1) {
    SelectionEvaluator::evaluate
              ((SelectionEvaluator *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffca0,
               (SelectionSet *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    SelectionSet::~SelectionSet((SelectionSet *)0x1a0c85);
    (**(code **)(*in_RDI + 0x58))(in_RDI,in_RDI + 0x177);
  }
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xcd));
  if (!bVar1) {
    SelectionEvaluator::evaluate((SelectionEvaluator *)CONCAT17(bVar1,in_stack_fffffffffffffcc8));
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffca0,
               (SelectionSet *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    SelectionSet::~SelectionSet((SelectionSet *)0x1a0e3c);
    (**(code **)(*in_RDI + 0x60))(in_RDI,in_RDI + 400);
  }
  uVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x23));
  if (!(bool)uVar2) {
    uVar3 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xcd));
    if (!(bool)uVar3) {
      operator&((SelectionManager *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffcb8)),
                in_stack_fffffffffffffcb0);
      pSVar5 = (SelectionManager *)(in_RDI + 0x1db);
      SelectionManager::operator=
                (in_stack_fffffffffffffc90,
                 (SelectionManager *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      SelectionManager::~SelectionManager(in_stack_fffffffffffffc90);
      OpenMD::operator-((SelectionManager *)
                        CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffcb8)),pSVar5);
      SelectionManager::operator=
                (in_stack_fffffffffffffc90,
                 (SelectionManager *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      SelectionManager::~SelectionManager(in_stack_fffffffffffffc90);
      OpenMD::operator-((SelectionManager *)
                        CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffcb8)),pSVar5);
      pSVar5 = (SelectionManager *)&stack0xfffffffffffffd38;
      SelectionManager::operator=
                (pSVar5,(SelectionManager *)
                        CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      SelectionManager::~SelectionManager(pSVar5);
      iVar4 = SelectionManager::getSelectionCount((SelectionManager *)0x1a0fde);
      *(int *)((long)in_RDI + 0xfa4) = iVar4;
      iVar4 = SelectionManager::getSelectionCount((SelectionManager *)0x1a1002);
      *(int *)(in_RDI + 0x1f5) = iVar4;
      iVar4 = SelectionManager::getSelectionCount((SelectionManager *)0x1a1026);
      *(int *)(in_RDI + 500) =
           *(int *)((long)in_RDI + 0xfa4) * (int)in_RDI[0x1f5] - ((iVar4 + 1) * iVar4) / 2;
    }
  }
  return;
}

Assistant:

RadialDistrFunc::RadialDistrFunc(SimInfo* info, const std::string& filename,
                                   const std::string& sele1,
                                   const std::string& sele2,
                                   unsigned int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript1_(sele1), selectionScript2_(sele2), evaluator1_(info),
      evaluator2_(info), seleMan1_(info), seleMan2_(info),
      sele1_minus_common_(info), sele2_minus_common_(info), common_(info) {
    evaluator1_.loadScriptString(sele1);
    evaluator2_.loadScriptString(sele2);

    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
      validateSelection1(seleMan1_);
    }
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
      validateSelection2(seleMan2_);
    }

    if (!evaluator1_.isDynamic() && !evaluator2_.isDynamic()) {
      // If all selections are static, we can precompute the number
      // of real pairs.
      common_             = seleMan1_ & seleMan2_;
      sele1_minus_common_ = seleMan1_ - common_;
      sele2_minus_common_ = seleMan2_ - common_;

      nSelected1_    = seleMan1_.getSelectionCount();
      nSelected2_    = seleMan2_.getSelectionCount();
      int nIntersect = common_.getSelectionCount();

      nPairs_ = nSelected1_ * nSelected2_ - (nIntersect + 1) * nIntersect / 2;
    }
  }